

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void move_item_forward(c2m_ctx_t c2m_ctx,MIR_item_t item)

{
  gen_ctx_conflict *pgVar1;
  MIR_item_t pMVar2;
  MIR_module_t pMVar3;
  MIR_item_t pMVar4;
  MIR_item_t pMVar5;
  
  pgVar1 = c2m_ctx->gen_ctx;
  pMVar2 = pgVar1->curr_func;
  if (pMVar2 == (MIR_item_t)0x0) {
    __assert_fail("curr_func != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2d6f,"void move_item_forward(c2m_ctx_t, MIR_item_t)");
  }
  pMVar3 = pMVar2->module;
  if ((pMVar3->items).tail == item) {
    DLIST_MIR_item_t_remove(&pMVar3->items,item);
    if (((item != (MIR_item_t)0x0) && (pMVar2 = pgVar1->curr_func, pMVar2 != (MIR_item_t)0x0)) &&
       (pMVar3 = pMVar2->module, (pMVar3->items).tail != (MIR_item_t_conflict)0x0)) {
      pMVar4 = (pMVar2->item_link).prev;
      pMVar5 = (pMVar3->items).head;
      if (pMVar4 == (MIR_item_t)0x0) {
        if (pMVar5 == pMVar2) {
          (pMVar2->item_link).prev = item;
          (item->item_link).next = pMVar2;
          (item->item_link).prev = (MIR_item_t)0x0;
          (pMVar3->items).head = item;
          return;
        }
      }
      else if (pMVar5 != (MIR_item_t)0x0) {
        (pMVar4->item_link).next = item;
        (item->item_link).prev = pMVar4;
        (pMVar2->item_link).prev = item;
        (item->item_link).next = pMVar2;
        return;
      }
    }
    dlist_assert_fail("insert_before","MIR_item_t");
  }
  return;
}

Assistant:

static void move_item_forward (c2m_ctx_t c2m_ctx, MIR_item_t item) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;

  assert (curr_func != NULL);
  if (DLIST_TAIL (MIR_item_t, curr_func->module->items) != item) return;
  DLIST_REMOVE (MIR_item_t, curr_func->module->items, item);
  DLIST_INSERT_BEFORE (MIR_item_t, curr_func->module->items, curr_func, item);
}